

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict *
validateEmbeddingWeightsBias
          (Result_conflict *__return_storage_ptr__,NeuralNetworkLayer *layer,WeightParams *weights,
          WeightParams *bias)

{
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  _Var1;
  WeightParams *pWVar2;
  bool bVar3;
  LayerCase LVar4;
  string *psVar5;
  uint64_t expectedUnits;
  allocator local_239;
  undefined1 local_238 [32];
  Result local_218;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [72];
  undefined1 local_118 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  WeightParamType local_88;
  WeightParamType biasValueType;
  WeightParamType weightsValueType;
  EmbeddingNDLayerParams *params_1;
  EmbeddingLayerParams *params;
  string local_60;
  uint64_t output_channels;
  uint64_t input_dim;
  bool has_bias;
  WeightParams *pWStack_28;
  WeightParams *bias_local;
  WeightParams *weights_local;
  NeuralNetworkLayer *layer_local;
  Result_conflict *r;
  
  input_dim._7_1_ = 0;
  pWStack_28 = bias;
  bias_local = weights;
  weights_local = (WeightParams *)layer;
  layer_local = (NeuralNetworkLayer *)__return_storage_ptr__;
  CoreML::Result::Result((Result *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_60);
  LVar4 = CoreML::Specification::NeuralNetworkLayer::layer_case((NeuralNetworkLayer *)weights_local)
  ;
  if (LVar4 == kEmbedding) {
    params_1 = (EmbeddingNDLayerParams *)
               CoreML::Specification::NeuralNetworkLayer::embedding
                         ((NeuralNetworkLayer *)weights_local);
    output_channels =
         CoreML::Specification::EmbeddingLayerParams::inputdim((EmbeddingLayerParams *)params_1);
    local_60._M_storage._M_storage =
         (uchar  [8])
         CoreML::Specification::EmbeddingLayerParams::outputchannels
                   ((EmbeddingLayerParams *)params_1);
    input_dim._6_1_ =
         CoreML::Specification::EmbeddingLayerParams::hasbias((EmbeddingLayerParams *)params_1);
    std::__cxx11::string::operator=((string *)&local_60,"Embedding");
  }
  else {
    if (LVar4 != kEmbeddingND) {
      input_dim._7_1_ = 1;
      biasValueType = FLOAT16;
      goto LAB_0040e83d;
    }
    _weightsValueType =
         CoreML::Specification::NeuralNetworkLayer::embeddingnd((NeuralNetworkLayer *)weights_local)
    ;
    output_channels = CoreML::Specification::EmbeddingNDLayerParams::vocabsize(_weightsValueType);
    local_60._M_storage._M_storage =
         (uchar  [8])CoreML::Specification::EmbeddingNDLayerParams::embeddingsize(_weightsValueType)
    ;
    input_dim._6_1_ = CoreML::Specification::EmbeddingNDLayerParams::hasbias(_weightsValueType);
    std::__cxx11::string::operator=((string *)&local_60,"EmbeddingND");
  }
  local_88 = CoreML::valueType(bias_local);
  local_b0._M_storage._M_storage._4_4_ = CoreML::valueType(pWStack_28);
  pWVar2 = bias_local;
  _Var1._M_storage = local_60._M_storage._M_storage;
  if ((local_88 == UNSPECIFIED) ||
     (((input_dim._6_1_ & 1) != 0 && (local_b0._M_storage._M_storage._4_4_ == UNSPECIFIED)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_118 + 0x28),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                   " \'");
    psVar5 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)weights_local);
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_118 + 0x28),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                   &local_d0,
                   "\' has invalid weights/bias fields. Field value types should match and should either be half or full precision."
                  );
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)(local_118 + 0x28));
    CoreML::Result::Result((Result *)local_118,INVALID_MODEL_PARAMETERS,&local_b0);
    CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)local_118);
    CoreML::Result::~Result((Result *)local_118);
    input_dim._7_1_ = 1;
    biasValueType = FLOAT16;
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else if (((input_dim._6_1_ & 1) == 0) ||
          (((local_88 != FLOAT16 || (local_b0._M_storage._M_storage._4_4_ != FLOAT32)) &&
           ((local_88 != FLOAT32 || (local_b0._M_storage._M_storage._4_4_ != FLOAT16)))))) {
    expectedUnits = output_channels * (long)local_60._M_storage._M_storage;
    psVar5 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)weights_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_1e8,"weight",
               (allocator *)((long)local_218.m_message._M_storage._M_storage + 7));
    CoreML::validateGeneralWeightParams
              ((Result_conflict *)local_1c8,pWVar2,expectedUnits,(uint64_t)_Var1._M_storage,
               &local_60,psVar5,(string *)local_1e8);
    CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)local_1c8);
    CoreML::Result::~Result((Result *)local_1c8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)local_218.m_message._M_storage._M_storage + 7));
    bVar3 = CoreML::Result::good((Result *)__return_storage_ptr__);
    pWVar2 = pWStack_28;
    _Var1._M_storage = local_60._M_storage._M_storage;
    if (bVar3) {
      if ((input_dim._6_1_ & 1) != 0) {
        psVar5 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)weights_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_238,"bias",&local_239);
        CoreML::validateGeneralWeightParams
                  ((Result_conflict *)(local_238 + 0x20),pWVar2,(uint64_t)_Var1._M_storage,1,
                   &local_60,psVar5,(string *)local_238);
        CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_238 + 0x20));
        CoreML::Result::~Result((Result *)(local_238 + 0x20));
        std::__cxx11::string::~string((string *)local_238);
        std::allocator<char>::~allocator((allocator<char> *)&local_239);
        bVar3 = CoreML::Result::good((Result *)__return_storage_ptr__);
        if (!bVar3) {
          input_dim._7_1_ = 1;
          biasValueType = FLOAT16;
          goto LAB_0040e83d;
        }
      }
      input_dim._7_1_ = 1;
      biasValueType = FLOAT16;
    }
    else {
      input_dim._7_1_ = 1;
      biasValueType = FLOAT16;
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1c8 + 0x28),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                   " layer \'");
    psVar5 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)weights_local);
    std::operator+(&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1c8 + 0x28),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   &local_180,
                   "has unmatched precisions of weights/bias They should either be half or full precision."
                  );
    CoreML::Result::Result
              ((Result *)(local_160 + 0x20),INVALID_MODEL_PARAMETERS,(string *)local_160);
    CoreML::Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_160 + 0x20));
    CoreML::Result::~Result((Result *)(local_160 + 0x20));
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)(local_1c8 + 0x28));
    input_dim._7_1_ = 1;
    biasValueType = FLOAT16;
  }
LAB_0040e83d:
  std::__cxx11::string::~string((string *)&local_60);
  if ((input_dim._7_1_ & 1) == 0) {
    CoreML::Result::~Result((Result *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static Result validateEmbeddingWeightsBias(const Specification::NeuralNetworkLayer& layer,
                                              const Specification::WeightParams& weights,
                                              const Specification::WeightParams& bias) {

    Result r;

    bool has_bias;
    uint64_t input_dim;
    uint64_t output_channels;
    std::string layer_type;

    switch(layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding: {
            const auto& params = layer.embedding();
            input_dim = params.inputdim();
            output_channels = params.outputchannels();
            has_bias = params.hasbias();
            layer_type = "Embedding";
            break;
        }
        case Specification::NeuralNetworkLayer::LayerCase::kEmbeddingND: {
            const auto& params = layer.embeddingnd();
            input_dim = params.vocabsize();
            output_channels = params.embeddingsize();
            has_bias = params.hasbias();
            layer_type = "EmbeddingND";
            break;
        }
        default:
            return r;
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(weights);
    biasValueType = valueType(bias);

    // Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)){
        std::string err = layer_type + " '" + layer.name() + "' has invalid weights/bias fields. Field value types should match and should either be half or full precision.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, layer_type + " layer '" + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }
    // Validate weight and bias sizes
    r = validateGeneralWeightParams(weights, input_dim * output_channels, output_channels,
                                    layer_type, layer.name(), "weight");
    if (!r.good()) return r;
    if (has_bias){
        r = validateGeneralWeightParams(bias, output_channels, 1,
                                        layer_type, layer.name(), "bias");
        if (!r.good()) return r;
    }

    return r;
}